

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

reference __thiscall
QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment_const&>
          (QVLABase<QPainter::PixmapFragment> *this,qsizetype prealloc,void *array,
          PixmapFragment *args)

{
  PixmapFragment *ptr;
  PixmapFragment *pPVar1;
  PixmapFragment *pPVar2;
  qsizetype in_RCX;
  void *in_RDX;
  qsizetype in_RSI;
  PixmapFragment *in_RDI;
  reference r;
  
  pPVar2 = in_RDI;
  ptr = (PixmapFragment *)QVLABaseBase::size((QVLABaseBase *)in_RDI);
  pPVar1 = (PixmapFragment *)QVLABaseBase::capacity((QVLABaseBase *)in_RDI);
  if (ptr == pPVar1) {
    growBy((QVLABase<QPainter::PixmapFragment> *)pPVar2,in_RSI,in_RDX,in_RCX);
  }
  end((QVLABase<QPainter::PixmapFragment> *)ptr);
  pPVar2 = q20::construct_at<QPainter::PixmapFragment,QPainter::PixmapFragment_const&,void>
                     (ptr,in_RDI);
  in_RDI->y = (qreal)((long)in_RDI->y + 1);
  return pPVar2;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }